

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.hpp
# Opt level: O0

string * __thiscall
CLI::ConfigBase::to_config
          (string *__return_storage_ptr__,ConfigBase *this,App *app,bool default_also,
          bool write_description,string *prefix)

{
  Option *this_00;
  undefined8 uVar1;
  byte bVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  ostream *poVar6;
  reference ppOVar7;
  reference ppAVar8;
  ulong uVar9;
  App *pAVar10;
  string *psVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  string local_580 [39];
  allocator<char> local_559;
  string local_558 [32];
  string local_538 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  App *local_4d8;
  App *p;
  undefined1 local_4b0 [8];
  string subname;
  App *subcom_1;
  iterator __end1_2;
  iterator __begin1_2;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *__range1_2;
  string local_450 [32];
  App *local_430;
  App *subcom;
  iterator __end1_1;
  iterator __begin1_1;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *__range1_1;
  undefined1 local_3f0 [8];
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> subcommands;
  string local_3b8;
  string local_398;
  string local_378;
  string local_358;
  results_t local_338;
  undefined1 local_320 [8];
  string value;
  string name;
  Option *opt;
  iterator __end2;
  iterator __begin2;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> local_2a8;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *local_290;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *group;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_248;
  allocator<char> local_239;
  value_type local_238;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_218;
  const_iterator local_210;
  byte local_201;
  undefined1 local_200 [7];
  bool defaultUsed;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groups;
  undefined1 local_1d8 [8];
  string commentLead;
  stringstream out;
  ostream local_1a8 [376];
  string *local_30;
  string *prefix_local;
  bool write_description_local;
  App *pAStack_20;
  bool default_also_local;
  App *app_local;
  ConfigBase *this_local;
  
  local_30 = prefix;
  prefix_local._6_1_ = write_description;
  prefix_local._7_1_ = default_also;
  pAStack_20 = app;
  app_local = (App *)this;
  this_local = (ConfigBase *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream((stringstream *)(commentLead.field_2._M_local_buf + 8))
  ;
  ::std::__cxx11::string::string((string *)local_1d8);
  ::std::__cxx11::string::push_back((char)(string *)local_1d8);
  ::std::__cxx11::string::push_back((char)local_1d8);
  App::get_groups_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_200,pAStack_20);
  local_201 = 0;
  local_218._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_200);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_210,&local_218);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"Options",&local_239);
  local_248 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_200,local_210,&local_238);
  ::std::__cxx11::string::~string((string *)&local_238);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_239);
  if ((prefix_local._6_1_ & 1) != 0) {
    poVar6 = ::std::operator<<(local_1a8,(string *)local_1d8);
    App::get_description_abi_cxx11_((string *)&__range1,pAStack_20);
    poVar6 = ::std::operator<<(poVar6,(string *)&__range1);
    ::std::operator<<(poVar6,'\n');
    ::std::__cxx11::string::~string((string *)&__range1);
  }
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_200);
  group = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_200);
  do {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&group);
    pAVar10 = pAStack_20;
    if (!bVar3) {
      std::function<bool_(const_CLI::App_*)>::function
                ((function<bool_(const_CLI::App_*)> *)&__range1_1);
      App::get_subcommands
                ((vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)local_3f0,pAVar10,
                 (function<bool_(const_CLI::App_*)> *)&__range1_1);
      std::function<bool_(const_CLI::App_*)>::~function
                ((function<bool_(const_CLI::App_*)> *)&__range1_1);
      __end1_1 = std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::begin
                           ((vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)local_3f0
                           );
      subcom = (App *)std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::end
                                ((vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)
                                 local_3f0);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end1_1,
                                (__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                                 *)&subcom), bVar3) {
        ppAVar8 = __gnu_cxx::
                  __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                  ::operator*(&__end1_1);
        local_430 = *ppAVar8;
        App::get_name_abi_cxx11_(local_430);
        uVar9 = ::std::__cxx11::string::empty();
        if ((uVar9 & 1) != 0) {
          if ((prefix_local._6_1_ & 1) != 0) {
            App::get_group_abi_cxx11_(local_430);
            uVar9 = ::std::__cxx11::string::empty();
            if ((uVar9 & 1) == 0) {
              poVar6 = ::std::operator<<(local_1a8,'\n');
              poVar6 = ::std::operator<<(poVar6,(string *)local_1d8);
              psVar11 = App::get_group_abi_cxx11_(local_430);
              poVar6 = ::std::operator<<(poVar6,(string *)psVar11);
              ::std::operator<<(poVar6," Options\n");
            }
          }
          bVar2 = prefix_local._7_1_;
          bVar4 = prefix_local._6_1_;
          pAVar10 = local_430;
          ::std::__cxx11::string::string((string *)&__range1_2,(string *)prefix);
          (**(this->super_Config)._vptr_Config)
                    (local_450,this,pAVar10,(ulong)(bVar2 & 1),(ulong)(bVar4 & 1),&__range1_2);
          ::std::operator<<(local_1a8,local_450);
          ::std::__cxx11::string::~string(local_450);
          ::std::__cxx11::string::~string((string *)&__range1_2);
        }
        __gnu_cxx::
        __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
        ::operator++(&__end1_1);
      }
      __end1_2 = std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::begin
                           ((vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)local_3f0
                           );
      subcom_1 = (App *)std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::end
                                  ((vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)
                                   local_3f0);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end1_2,
                                (__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                                 *)&subcom_1), bVar3) {
        ppAVar8 = __gnu_cxx::
                  __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                  ::operator*(&__end1_2);
        subname.field_2._8_8_ = *ppAVar8;
        App::get_name_abi_cxx11_((App *)subname.field_2._8_8_);
        uVar9 = ::std::__cxx11::string::empty();
        if ((uVar9 & 1) == 0) {
          bVar3 = App::get_configurable((App *)subname.field_2._8_8_);
          if ((bVar3) &&
             (bVar3 = App::got_subcommand(pAStack_20,(App *)subname.field_2._8_8_), bVar3)) {
            uVar9 = ::std::__cxx11::string::empty();
            if (((uVar9 & 1) == 0) || (pAVar10 = App::get_parent(pAStack_20), pAVar10 == (App *)0x0)
               ) {
              poVar6 = ::std::operator<<(local_1a8,'[');
              poVar6 = ::std::operator<<(poVar6,(string *)prefix);
              psVar11 = App::get_name_abi_cxx11_((App *)subname.field_2._8_8_);
              poVar6 = ::std::operator<<(poVar6,(string *)psVar11);
              ::std::operator<<(poVar6,"]\n");
            }
            else {
              psVar11 = App::get_name_abi_cxx11_(pAStack_20);
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &p,psVar11,".");
              psVar11 = App::get_name_abi_cxx11_((App *)subname.field_2._8_8_);
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_4b0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &p,psVar11);
              ::std::__cxx11::string::~string((string *)&p);
              local_4d8 = App::get_parent(pAStack_20);
              while (pAVar10 = App::get_parent(local_4d8), pAVar10 != (App *)0x0) {
                psVar11 = App::get_name_abi_cxx11_(local_4d8);
                ::std::operator+(&local_518,psVar11,".");
                ::std::operator+(&local_4f8,&local_518,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_4b0);
                ::std::__cxx11::string::operator=((string *)local_4b0,(string *)&local_4f8);
                ::std::__cxx11::string::~string((string *)&local_4f8);
                ::std::__cxx11::string::~string((string *)&local_518);
                local_4d8 = App::get_parent(local_4d8);
              }
              poVar6 = ::std::operator<<(local_1a8,'[');
              poVar6 = ::std::operator<<(poVar6,(string *)local_4b0);
              ::std::operator<<(poVar6,"]\n");
              ::std::__cxx11::string::~string((string *)local_4b0);
            }
            bVar2 = prefix_local._7_1_;
            bVar4 = prefix_local._6_1_;
            uVar1 = subname.field_2._8_8_;
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string<std::allocator<char>>(local_558,"",&local_559);
            (**(this->super_Config)._vptr_Config)
                      (local_538,this,uVar1,(ulong)(bVar2 & 1),(ulong)(bVar4 & 1),local_558);
            ::std::operator<<(local_1a8,local_538);
            ::std::__cxx11::string::~string(local_538);
            ::std::__cxx11::string::~string(local_558);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_559);
          }
          else {
            bVar2 = prefix_local._7_1_;
            bVar4 = prefix_local._6_1_;
            uVar1 = subname.field_2._8_8_;
            psVar11 = App::get_name_abi_cxx11_((App *)subname.field_2._8_8_);
            ::std::operator+(&local_5c0,prefix,psVar11);
            ::std::operator+(&local_5a0,&local_5c0,".");
            (**(this->super_Config)._vptr_Config)
                      (local_580,this,uVar1,(ulong)(bVar2 & 1),(ulong)(bVar4 & 1),&local_5a0);
            ::std::operator<<(local_1a8,local_580);
            ::std::__cxx11::string::~string(local_580);
            ::std::__cxx11::string::~string((string *)&local_5a0);
            ::std::__cxx11::string::~string((string *)&local_5c0);
          }
        }
        __gnu_cxx::
        __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
        ::operator++(&__end1_2);
      }
      ::std::__cxx11::stringstream::str();
      std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::~vector
                ((vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)local_3f0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_200);
      ::std::__cxx11::string::~string((string *)local_1d8);
      ::std::__cxx11::stringstream::~stringstream
                ((stringstream *)(commentLead.field_2._M_local_buf + 8));
      return __return_storage_ptr__;
    }
    __range2 = (vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)
               __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
    bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __range2,"Options");
    if ((bVar3) || (uVar9 = ::std::__cxx11::string::empty(), (uVar9 & 1) != 0)) {
      if ((local_201 & 1) == 0) {
        local_201 = 1;
        goto LAB_0011598b;
      }
    }
    else {
LAB_0011598b:
      if ((((prefix_local._6_1_ & 1) != 0) &&
          (bVar3 = ::std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)__range2,"Options"), bVar3)) &&
         (uVar9 = ::std::__cxx11::string::empty(), (uVar9 & 1) == 0)) {
        poVar6 = ::std::operator<<(local_1a8,'\n');
        poVar6 = ::std::operator<<(poVar6,(string *)local_1d8);
        poVar6 = ::std::operator<<(poVar6,(string *)__range2);
        ::std::operator<<(poVar6," Options\n");
      }
      pAVar10 = pAStack_20;
      std::function<bool_(const_CLI::Option_*)>::function
                ((function<bool_(const_CLI::Option_*)> *)&__begin2);
      App::get_options(&local_2a8,pAVar10,(function<bool_(const_CLI::Option_*)> *)&__begin2);
      std::function<bool_(const_CLI::Option_*)>::~function
                ((function<bool_(const_CLI::Option_*)> *)&__begin2);
      local_290 = &local_2a8;
      __end2 = std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::begin
                         (local_290);
      opt = (Option *)
            std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::end(local_290);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
                                         *)&opt), bVar3) {
        ppOVar7 = __gnu_cxx::
                  __normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
                  ::operator*(&__end2);
        this_00 = *ppOVar7;
        bVar3 = OptionBase<CLI::Option>::get_configurable(&this_00->super_OptionBase<CLI::Option>);
        if (bVar3) {
          psVar11 = OptionBase<CLI::Option>::get_group_abi_cxx11_
                              (&this_00->super_OptionBase<CLI::Option>);
          bVar3 = ::std::operator!=(psVar11,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)__range2);
          if (bVar3) {
            bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)__range2,"Options");
            if (bVar3) {
              OptionBase<CLI::Option>::get_group_abi_cxx11_(&this_00->super_OptionBase<CLI::Option>)
              ;
              uVar9 = ::std::__cxx11::string::empty();
              if ((uVar9 & 1) != 0) goto LAB_00115bcb;
            }
          }
          else {
LAB_00115bcb:
            psVar11 = Option::get_single_name_abi_cxx11_(this_00);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&value.field_2 + 8),prefix,psVar11);
            Option::reduced_results_abi_cxx11_(&local_338,this_00);
            detail::ini_join((string *)local_320,&local_338,this->arraySeparator,this->arrayStart,
                             this->arrayEnd);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_338);
            uVar9 = ::std::__cxx11::string::empty();
            if (((uVar9 & 1) != 0) && ((prefix_local._7_1_ & 1) != 0)) {
              Option::get_default_str_abi_cxx11_(&local_358,this_00);
              bVar4 = ::std::__cxx11::string::empty();
              ::std::__cxx11::string::~string((string *)&local_358);
              if (((bVar4 ^ 0xff) & 1) == 0) {
                iVar5 = Option::get_expected_min(this_00);
                if (iVar5 == 0) {
                  ::std::__cxx11::string::operator=((string *)local_320,"false");
                }
              }
              else {
                Option::get_default_str_abi_cxx11_(&local_398,this_00);
                detail::convert_arg_for_ini(&local_378,&local_398);
                ::std::__cxx11::string::operator=((string *)local_320,(string *)&local_378);
                ::std::__cxx11::string::~string((string *)&local_378);
                ::std::__cxx11::string::~string((string *)&local_398);
              }
            }
            uVar9 = ::std::__cxx11::string::empty();
            if ((uVar9 & 1) == 0) {
              if (((prefix_local._6_1_ & 1) != 0) &&
                 (bVar3 = Option::has_description(this_00), bVar3)) {
                ::std::operator<<(local_1a8,'\n');
                poVar6 = ::std::operator<<(local_1a8,(string *)local_1d8);
                psVar11 = Option::get_description_abi_cxx11_(this_00);
                ::std::__cxx11::string::string
                          ((string *)
                           &subcommands.
                            super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,(string *)psVar11);
                detail::fix_newlines
                          (&local_3b8,(string *)local_1d8,
                           (string *)
                           &subcommands.
                            super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
                poVar6 = ::std::operator<<(poVar6,(string *)&local_3b8);
                ::std::operator<<(poVar6,'\n');
                ::std::__cxx11::string::~string((string *)&local_3b8);
                ::std::__cxx11::string::~string
                          ((string *)
                           &subcommands.
                            super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
              }
              poVar6 = ::std::operator<<(local_1a8,(string *)(value.field_2._M_local_buf + 8));
              poVar6 = ::std::operator<<(poVar6,this->valueDelimiter);
              poVar6 = ::std::operator<<(poVar6,(string *)local_320);
              ::std::operator<<(poVar6,'\n');
            }
            ::std::__cxx11::string::~string((string *)local_320);
            ::std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
          }
        }
        __gnu_cxx::
        __normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
        ::operator++(&__end2);
      }
      std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::~vector(&local_2a8);
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

inline std::string
ConfigBase::to_config(const App *app, bool default_also, bool write_description, std::string prefix) const {
    std::stringstream out;
    std::string commentLead;
    commentLead.push_back(commentChar);
    commentLead.push_back(' ');

    std::vector<std::string> groups = app->get_groups();
    bool defaultUsed = false;
    groups.insert(groups.begin(), std::string("Options"));
    if(write_description) {
        out << commentLead << app->get_description() << '\n';
    }
    for(auto &group : groups) {
        if(group == "Options" || group.empty()) {
            if(defaultUsed) {
                continue;
            }
            defaultUsed = true;
        }
        if(write_description && group != "Options" && !group.empty()) {
            out << '\n' << commentLead << group << " Options\n";
        }
        for(const Option *opt : app->get_options({})) {

            // Only process options that are configurable
            if(opt->get_configurable()) {
                if(opt->get_group() != group) {
                    if(!(group == "Options" && opt->get_group().empty())) {
                        continue;
                    }
                }
                std::string name = prefix + opt->get_single_name();
                std::string value = detail::ini_join(opt->reduced_results(), arraySeparator, arrayStart, arrayEnd);

                if(value.empty() && default_also) {
                    if(!opt->get_default_str().empty()) {
                        value = detail::convert_arg_for_ini(opt->get_default_str());
                    } else if(opt->get_expected_min() == 0) {
                        value = "false";
                    }
                }

                if(!value.empty()) {
                    if(write_description && opt->has_description()) {
                        out << '\n';
                        out << commentLead << detail::fix_newlines(commentLead, opt->get_description()) << '\n';
                    }
                    out << name << valueDelimiter << value << '\n';
                }
            }
        }
    }
    auto subcommands = app->get_subcommands({});
    for(const App *subcom : subcommands) {
        if(subcom->get_name().empty()) {
            if(write_description && !subcom->get_group().empty()) {
                out << '\n' << commentLead << subcom->get_group() << " Options\n";
            }
            out << to_config(subcom, default_also, write_description, prefix);
        }
    }

    for(const App *subcom : subcommands) {
        if(!subcom->get_name().empty()) {
            if(subcom->get_configurable() && app->got_subcommand(subcom)) {
                if(!prefix.empty() || app->get_parent() == nullptr) {
                    out << '[' << prefix << subcom->get_name() << "]\n";
                } else {
                    std::string subname = app->get_name() + "." + subcom->get_name();
                    auto p = app->get_parent();
                    while(p->get_parent() != nullptr) {
                        subname = p->get_name() + "." + subname;
                        p = p->get_parent();
                    }
                    out << '[' << subname << "]\n";
                }
                out << to_config(subcom, default_also, write_description, "");
            } else {
                out << to_config(subcom, default_also, write_description, prefix + subcom->get_name() + ".");
            }
        }
    }

    return out.str();
}